

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Set_Var_Design(TT_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  uint uVar1;
  FT_Memory memory;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  FT_Fixed *pFVar5;
  FT_Fixed *pFVar6;
  long lVar7;
  long lVar8;
  uint num_coords_00;
  GX_Blend pGVar9;
  FT_Error error;
  FT_Error local_44;
  FT_MM_Var *local_40;
  uint local_34;
  
  local_44 = 0;
  memory = (face->root).memory;
  pGVar9 = face->blend;
  if (pGVar9 == (GX_Blend)0x0) {
    pFVar6 = (FT_Fixed *)0x0;
    local_44 = TT_Get_MM_Var(face,(FT_MM_Var **)0x0);
    if (local_44 != 0) goto LAB_00253cbe;
    pGVar9 = face->blend;
  }
  pFVar5 = pGVar9->coords;
  local_40 = pGVar9->mmvar;
  uVar1 = local_40->num_axis;
  num_coords_00 = num_coords;
  if (uVar1 < num_coords) {
    num_coords_00 = uVar1;
  }
  if (pFVar5 == (FT_Fixed *)0x0) {
    local_34 = num_coords_00;
    pFVar5 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)uVar1,(void *)0x0,&local_44);
    pFVar6 = (FT_Fixed *)0x0;
    pGVar9->coords = pFVar5;
    num_coords_00 = local_34;
    if (local_44 != 0) goto LAB_00253cbe;
  }
  if (num_coords_00 == 0) {
    bVar4 = false;
  }
  else {
    if ((ulong)uVar1 < (ulong)num_coords) {
      num_coords = uVar1;
    }
    lVar7 = 0;
    lVar8 = 0;
    bVar4 = false;
    do {
      if (pFVar5[lVar8] != coords[lVar8]) {
        pFVar5[lVar8] = coords[lVar8];
        bVar4 = true;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -8;
    } while (num_coords != (uint)lVar8);
    pFVar5 = (FT_Fixed *)((long)pFVar5 - lVar7);
  }
  uVar2 = (face->root).face_index;
  uVar1 = local_40->num_axis;
  if ((uVar2 & 0x7fff0000) == 0) {
    if (num_coords_00 < uVar1) {
      pFVar6 = &local_40->axis[num_coords_00].def;
      lVar7 = 0;
      do {
        if (pFVar5[lVar7] != *pFVar6) {
          pFVar5[lVar7] = *pFVar6;
          bVar4 = true;
        }
        pFVar6 = pFVar6 + 6;
        lVar7 = lVar7 + 1;
      } while (uVar1 - num_coords_00 != (int)lVar7);
    }
  }
  else if (num_coords_00 < uVar1) {
    lVar7 = *(long *)((long)&local_40->namedstyle[-1].coords +
                     (ulong)((uint)uVar2 >> 0xc & 0xfffffff0));
    lVar8 = 0;
    do {
      lVar3 = *(long *)((ulong)num_coords_00 * 8 + lVar7 + lVar8 * 8);
      if (pFVar5[lVar8] != lVar3) {
        pFVar5[lVar8] = lVar3;
        bVar4 = true;
      }
      lVar8 = lVar8 + 1;
    } while (uVar1 - num_coords_00 != (int)lVar8);
  }
  if (!bVar4 && pGVar9->normalizedcoords != (FT_Fixed *)0x0) {
    return -1;
  }
  pFVar6 = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)uVar1,(void *)0x0,&local_44);
  if (local_44 == 0) {
    if (face->blend->avar_loaded == '\0') {
      ft_var_load_avar(face);
    }
    ft_var_to_normalized(face,num_coords_00,pGVar9->coords,pFVar6);
    local_44 = tt_set_mm_blend(face,local_40->num_axis,pFVar6,'\0');
    if (local_44 == 0) {
      (face->root).face_flags =
           (ulong)(num_coords_00 != 0) << 0xf | (face->root).face_flags & 0xffffffffffff7fffU;
    }
  }
LAB_00253cbe:
  ft_mem_free(memory,pFVar6);
  return local_44;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Set_Var_Design( TT_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
    FT_Error    error  = FT_Err_Ok;
    GX_Blend    blend;
    FT_MM_Var*  mmvar;
    FT_UInt     i;
    FT_Memory   memory = face->root.memory;

    FT_Fixed*  c;
    FT_Fixed*  n;
    FT_Fixed*  normalized = NULL;

    FT_Bool  have_diff = 0;


    if ( !face->blend )
    {
      if ( FT_SET_ERROR( TT_Get_MM_Var( face, NULL ) ) )
        goto Exit;
    }

    blend = face->blend;
    mmvar = blend->mmvar;

    if ( num_coords > mmvar->num_axis )
    {
      FT_TRACE2(( "TT_Set_Var_Design:"
                  " only using first %d of %d coordinates\n",
                  mmvar->num_axis, num_coords ));
      num_coords = mmvar->num_axis;
    }

    if ( !blend->coords )
    {
      if ( FT_NEW_ARRAY( blend->coords, mmvar->num_axis ) )
        goto Exit;
    }

    c = blend->coords;
    n = coords;
    for ( i = 0; i < num_coords; i++, n++, c++ )
    {
      if ( *c != *n )
      {
        *c        = *n;
        have_diff = 1;
      }
    }

    if ( FT_IS_NAMED_INSTANCE( FT_FACE( face ) ) )
    {
      FT_UInt              instance_index;
      FT_Var_Named_Style*  named_style;


      instance_index = (FT_UInt)face->root.face_index >> 16;
      named_style    = mmvar->namedstyle + instance_index - 1;

      n = named_style->coords + num_coords;
      for ( ; i < mmvar->num_axis; i++, n++, c++ )
      {
        if ( *c != *n )
        {
          *c        = *n;
          have_diff = 1;
        }
      }
    }
    else
    {
      FT_Var_Axis*  a;


      a = mmvar->axis + num_coords;
      for ( ; i < mmvar->num_axis; i++, a++, c++ )
      {
        if ( *c != a->def )
        {
          *c        = a->def;
          have_diff = 1;
        }
      }
    }

    /* return value -1 indicates `no change';                      */
    /* we can exit early if `normalizedcoords' is already computed */
    if ( blend->normalizedcoords && !have_diff )
      return -1;

    if ( FT_NEW_ARRAY( normalized, mmvar->num_axis ) )
      goto Exit;

    if ( !face->blend->avar_loaded )
      ft_var_load_avar( face );

    FT_TRACE5(( "TT_Set_Var_Design:\n" ));
    FT_TRACE5(( "  normalized design coordinates:\n" ));
    ft_var_to_normalized( face, num_coords, blend->coords, normalized );

    error = tt_set_mm_blend( face, mmvar->num_axis, normalized, 0 );
    if ( error )
      goto Exit;

    if ( num_coords )
      face->root.face_flags |= FT_FACE_FLAG_VARIATION;
    else
      face->root.face_flags &= ~FT_FACE_FLAG_VARIATION;

  Exit:
    FT_FREE( normalized );
    return error;
  }